

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O2

void signal_cb(uv_signal_t *handle,int signum)

{
  uint uVar1;
  int64_t eval_b;
  int64_t eval_a;
  
  if ((long)signum != (long)*(int *)&handle[1].data) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
            ,0x6a,"signum","==","ctx->signum",(long)signum,"==",(long)*(int *)&handle[1].data);
    abort();
  }
  uVar1 = handle[-1].dispatched_signals + 1;
  handle[-1].dispatched_signals = uVar1;
  if (uVar1 != 10) {
    return;
  }
  if (handle[-1].caught_signals == 0) {
    uv_close(handle,0);
    return;
  }
  if (handle[-1].caught_signals == 1) {
    uv_signal_stop();
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
          ,0x71,"0");
  abort();
}

Assistant:

static void signal_cb(uv_signal_t* handle, int signum) {
  struct signal_ctx* ctx = container_of(handle, struct signal_ctx, handle);
  ASSERT_EQ(signum, ctx->signum);
  if (++ctx->ncalls == NSIGNALS) {
    if (ctx->stop_or_close == STOP)
      uv_signal_stop(handle);
    else if (ctx->stop_or_close == CLOSE)
      uv_close((uv_handle_t*)handle, NULL);
    else
      ASSERT(0);
  }
}